

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

void * __thiscall
xercesc_4_0::DOMDocumentImpl::setUserData
          (DOMDocumentImpl *this,DOMNodeImpl *n,XMLCh *key,void *data,DOMUserDataHandler *handler)

{
  bool bVar1;
  uint key2;
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *pRVar2;
  KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *this_00;
  undefined1 local_90 [8];
  RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  enumKeys;
  DOMUserDataRecord *oldDataRecord;
  void *pvStack_38;
  uint keyId;
  void *oldData;
  DOMUserDataHandler *handler_local;
  void *data_local;
  XMLCh *key_local;
  DOMNodeImpl *n_local;
  DOMDocumentImpl *this_local;
  
  pvStack_38 = (void *)0x0;
  key2 = XMLStringPool::addOrFind(&this->fUserDataTableKeys,key);
  if (this->fUserDataTable ==
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    pRVar2 = (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
              *)XMemory::operator_new(0x30,this->fMemoryManager);
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOf(pRVar2,0x6d,true,this->fMemoryManager);
    this->fUserDataTable = pRVar2;
  }
  else {
    enumKeys.fLockPrimaryKey =
         RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
         ::get(this->fUserDataTable,n,key2);
    if ((KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)enumKeys.fLockPrimaryKey !=
        (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)0x0) {
      pvStack_38 = KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>::getKey
                             ((KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)
                              enumKeys.fLockPrimaryKey);
      RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
      ::removeKey(this->fUserDataTable,n,key2);
    }
  }
  if (data == (void *)0x0) {
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                *)local_90,this->fUserDataTable,false,this->fMemoryManager);
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::setPrimaryKey((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                     *)local_90,n);
    bVar1 = RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
            ::hasMoreElements((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                               *)local_90);
    if (!bVar1) {
      DOMNodeImpl::hasUserData(n,false);
    }
    RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOfEnumerator
              ((RefHash2KeysTableOfEnumerator<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
                *)local_90);
  }
  else {
    pRVar2 = this->fUserDataTable;
    this_00 = (KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler> *)
              XMemory::operator_new(0x10,this->fMemoryManager);
    KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>::KeyRefPair(this_00,data,handler);
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::put(pRVar2,n,key2,this_00);
  }
  return pvStack_38;
}

Assistant:

void* DOMDocumentImpl::setUserData(DOMNodeImpl* n, const XMLCh* key, void* data, DOMUserDataHandler* handler)
{
    void* oldData = 0;
    unsigned int keyId=fUserDataTableKeys.addOrFind(key);

    if (!fUserDataTable) {
        // create the table on heap so that it can be cleaned in destructor
        fUserDataTable = new (fMemoryManager) RefHash2KeysTableOf<DOMUserDataRecord, PtrHasher>
        (
            109
            , true
            , fMemoryManager
        );
    }
    else {
        DOMUserDataRecord* oldDataRecord = fUserDataTable->get((void*)n, keyId);

        if (oldDataRecord) {
            oldData = oldDataRecord->getKey();
            fUserDataTable->removeKey((void*)n, keyId);
        }
    }

    if (data) {

        // clone the key first, and create the DOMUserDataRecord
        // create on the heap and adopted by the hashtable which will delete it upon removal.
        fUserDataTable->put((void*)n, keyId, new (fMemoryManager) DOMUserDataRecord(data, handler));
    }
    else {
        RefHash2KeysTableOfEnumerator<DOMUserDataRecord, PtrHasher> enumKeys(fUserDataTable, false, fMemoryManager);
        enumKeys.setPrimaryKey(n);
        if (!enumKeys.hasMoreElements())
            n->hasUserData(false);
    }

    return oldData;
}